

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop
          (cmLocalUnixMakefileGenerator3 *this,ostream *makefileStream)

{
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar1;
  pointer puVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  string hack;
  string hack_cmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  char *vcs_rule;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,
             "#=============================================================================\n",0x4f
            );
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# Special targets provided by cmake.\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n",1);
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hack._M_dataplus._M_p = (pointer)&hack.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hack,".SUFFIXES","");
  WriteMakeRule(this,makefileStream,"Disable implicit rules so canonical targets will work.",&hack,
                &no_depends,&no_commands,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != &hack.field_2) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  bVar3 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
  if (!bVar3) {
    bVar3 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
    if ((!bVar3) && (this->BorlandMakeCurlyHack == false)) {
      lVar4 = 0;
      do {
        vcs_rule = *(char **)((long)&DAT_00be6710 + lVar4);
        hack_cmd._M_dataplus._M_p = (pointer)0x0;
        hack_cmd._M_string_length = 0;
        hack_cmd.field_2._M_allocated_capacity = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hack_cmd,
                   &vcs_rule);
        hack._M_dataplus._M_p = (pointer)&hack.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&hack,"%","");
        WriteMakeRule(this,makefileStream,"Disable VCS-based implicit rules.",&hack,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&hack_cmd,&no_commands,false,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)hack._M_dataplus._M_p != &hack.field_2) {
          operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&hack_cmd);
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x28);
    }
  }
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             (char (*) [29])".hpux_make_needs_suffix_list");
  hack._M_dataplus._M_p = (pointer)&hack.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hack,".SUFFIXES","");
  WriteMakeRule(this,makefileStream,(char *)0x0,&hack,&depends,&no_commands,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != &hack.field_2) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  bVar3 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n.ERASE\n\n",9);
  }
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  hack._M_dataplus._M_p = (pointer)&hack.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hack,"CMAKE_VERBOSE_MAKEFILE","");
  bVar3 = cmMakefile::IsOn(this_00,&hack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != &hack.field_2) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (makefileStream,"# Produce verbose output by default.\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"VERBOSE = 1\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n",1);
  }
  bVar3 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if (bVar3) {
    lVar4 = 0x20;
    pcVar5 = "!ifndef VERBOSE\n.SILENT\n!endif\n\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (makefileStream,
               "# Command-line flag to silence nested $(MAKE).\n$(VERBOSE)MAKESILENT = -s\n\n",0x4a)
    ;
    lVar4 = 0x3c;
    pcVar5 = "#Suppress display of executed commands.\n$(VERBOSE).SILENT:\n\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,pcVar5,lVar4);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  hack._M_dataplus._M_p = (pointer)&hack.field_2;
  puVar2 = pcVar1[1].LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&hack,puVar2,
             (long)&((pcVar1[1].QtAutoGen._M_t.
                      super___uniq_ptr_impl<cmQtAutoGenGlobalInitializer,_std::default_delete<cmQtAutoGenGlobalInitializer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmQtAutoGenGlobalInitializer_*,_std::default_delete<cmQtAutoGenGlobalInitializer>_>
                      .super__Head_base<0UL,_cmQtAutoGenGlobalInitializer_*,_false>._M_head_impl)->
                    Initializers_).
                    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
             + (long)&(puVar2->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  if (hack._M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&no_depends,
               &hack);
  }
  lVar4 = *(long *)&pcVar1[1].ProjectMap._M_t._M_impl.super__Rb_tree_header._M_header;
  hack_cmd._M_dataplus._M_p = (pointer)&hack_cmd.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&hack_cmd,lVar4,
             (long)&(pcVar1[1].ProjectMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                    _M_color + lVar4);
  if (hack_cmd._M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&no_commands,
               &hack_cmd);
  }
  vcs_rule = (char *)&local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vcs_rule,"cmake_force","");
  WriteMakeRule(this,makefileStream,"A target that is always out of date.",(string *)&vcs_rule,
                &no_depends,&no_commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vcs_rule != &local_58) {
    operator_delete(vcs_rule,local_58._M_allocated_capacity + 1);
  }
  WriteMakeVariables(this,makefileStream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack_cmd._M_dataplus._M_p != &hack_cmd.field_2) {
    operator_delete(hack_cmd._M_dataplus._M_p,hack_cmd.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != &hack.field_2) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_commands);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop(
  std::ostream& makefileStream)
{
  this->WriteDivider(makefileStream);
  makefileStream << "# Special targets provided by cmake.\n"
                 << "\n";

  std::vector<std::string> no_commands;
  std::vector<std::string> no_depends;

  // Special target to cleanup operation of make tool.
  // This should be the first target except for the default_target in
  // the interface Makefile.
  this->WriteMakeRule(makefileStream,
                      "Disable implicit rules so canonical targets will work.",
                      ".SUFFIXES", no_depends, no_commands, false);

  if (!this->IsNMake() && !this->IsWatcomWMake() &&
      !this->BorlandMakeCurlyHack) {
    // turn off RCS and SCCS automatic stuff from gmake
    constexpr const char* vcs_rules[] = {
      "%,v", "RCS/%", "RCS/%,v", "SCCS/s.%", "s.%",
    };
    for (const auto* vcs_rule : vcs_rules) {
      std::vector<std::string> vcs_depend;
      vcs_depend.emplace_back(vcs_rule);
      this->WriteMakeRule(makefileStream, "Disable VCS-based implicit rules.",
                          "%", vcs_depend, no_commands, false);
    }
  }
  // Add a fake suffix to keep HP happy.  Must be max 32 chars for SGI make.
  std::vector<std::string> depends;
  depends.emplace_back(".hpux_make_needs_suffix_list");
  this->WriteMakeRule(makefileStream, nullptr, ".SUFFIXES", depends,
                      no_commands, false);
  if (this->IsWatcomWMake()) {
    // Switch on WMake feature, if an error or interrupt occurs during
    // makefile processing, the current target being made may be deleted
    // without prompting (the same as command line -e option).
    /* clang-format off */
    makefileStream <<
      "\n"
      ".ERASE\n"
      "\n"
      ;
    /* clang-format on */
  }
  if (this->Makefile->IsOn("CMAKE_VERBOSE_MAKEFILE")) {
    /* clang-format off */
    makefileStream
      << "# Produce verbose output by default.\n"
      << "VERBOSE = 1\n"
      << "\n";
    /* clang-format on */
  }
  if (this->IsWatcomWMake()) {
    /* clang-format off */
    makefileStream <<
      "!ifndef VERBOSE\n"
      ".SILENT\n"
      "!endif\n"
      "\n"
      ;
    /* clang-format on */
  } else {
    makefileStream << "# Command-line flag to silence nested $(MAKE).\n"
                      "$(VERBOSE)MAKESILENT = -s\n"
                      "\n";

    // Write special target to silence make output.  This must be after
    // the default target in case VERBOSE is set (which changes the
    // name).  The setting of CMAKE_VERBOSE_MAKEFILE to ON will cause a
    // "VERBOSE=1" to be added as a make variable which will change the
    // name of this special target.  This gives a make-time choice to
    // the user.
    // Write directly to the stream since WriteMakeRule escapes '$'.
    makefileStream << "#Suppress display of executed commands.\n"
                      "$(VERBOSE).SILENT:\n"
                      "\n";
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  std::string hack = gg->GetEmptyRuleHackDepends();
  if (!hack.empty()) {
    no_depends.push_back(std::move(hack));
  }
  std::string hack_cmd = gg->GetEmptyRuleHackCommand();
  if (!hack_cmd.empty()) {
    no_commands.push_back(std::move(hack_cmd));
  }

  // Special symbolic target that never exists to force dependers to
  // run their rules.
  this->WriteMakeRule(makefileStream, "A target that is always out of date.",
                      "cmake_force", no_depends, no_commands, true);

  // Variables for reference by other rules.
  this->WriteMakeVariables(makefileStream);
}